

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Node * __thiscall anon_unknown.dwarf_550beb::Db::parseDecltype(Db *this)

{
  char *pcVar1;
  char (*pacVar2) [2];
  EnclosingExpr *pEVar3;
  char *args_2;
  Node *E;
  Node *local_10;
  
  pacVar2 = (char (*) [2])this->First;
  args_2 = this->Last;
  if (pacVar2 == (char (*) [2])args_2) {
    return (Node *)0x0;
  }
  if ((*pacVar2)[0] == 'D') {
    pcVar1 = *pacVar2 + 1;
    this->First = pcVar1;
    if ((pcVar1 == args_2) || (*pcVar1 != 't')) {
      pcVar1 = this->First;
      if (pcVar1 == args_2) {
        return (Node *)0x0;
      }
      if (*pcVar1 != 'T') {
        return (Node *)0x0;
      }
      pacVar2 = (char (*) [2])(pcVar1 + 1);
    }
    else {
      pacVar2 = pacVar2 + 1;
    }
    this->First = *pacVar2;
    local_10 = parseExpr(this);
    if (((local_10 != (Node *)0x0) && (pcVar1 = this->First, pcVar1 != this->Last)) &&
       (*pcVar1 == 'E')) {
      this->First = pcVar1 + 1;
      pEVar3 = (anonymous_namespace)::Db::
               make<(anonymous_namespace)::EnclosingExpr,char_const(&)[10],(anonymous_namespace)::Node*&,char_const(&)[2]>
                         ((Db *)this,(char (*) [10])"decltype(",&local_10,(char (*) [2])args_2);
      return (Node *)pEVar3;
    }
  }
  return (Node *)0x0;
}

Assistant:

bool consumeIf(char C) {
    if (First != Last && *First == C) {
      ++First;
      return true;
    }
    return false;
  }